

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_instance_cache.cpp
# Opt level: O2

shared_ptr<duckdb::DuckDB,_true> __thiscall
duckdb::DBInstanceCache::CreateInstance
          (DBInstanceCache *this,string *database,DBConfig *config,bool cache_instance,
          function<void_(duckdb::DuckDB_&)> *on_create)

{
  pthread_mutex_t *__mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::DuckDB,_true> sVar1;
  
  __mutex = (pthread_mutex_t *)((long)&database[1].field_2 + 8);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  CreateInstanceInternal
            (this,database,config,cache_instance,
             (function<void_(duckdb::DuckDB_&)> *)((ulong)on_create & 0xffffffff));
  pthread_mutex_unlock(__mutex);
  sVar1.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::DuckDB,_true>)
         sVar1.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<DuckDB> DBInstanceCache::CreateInstance(const string &database, DBConfig &config, bool cache_instance,
                                                   const std::function<void(DuckDB &)> &on_create) {
	lock_guard<mutex> l(cache_lock);
	return CreateInstanceInternal(database, config, cache_instance, on_create);
}